

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::zeroCol(HFactor *this,HighsInt jCol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  long lVar16;
  
  piVar4 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)piVar4[jCol];
  if (0 < lVar13) {
    piVar5 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = (long)(this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[jCol];
    lVar13 = lVar13 + lVar16;
    piVar6 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar1 = piVar5[lVar16];
      lVar12 = (long)piVar7[iVar1];
      iVar2 = piVar6[iVar1];
      piVar6[iVar1] = (int)((long)iVar2 + -1);
      piVar15 = piVar8 + lVar12;
      do {
        piVar14 = piVar15;
        piVar15 = piVar14 + 1;
      } while (*piVar14 != jCol);
      *piVar14 = piVar8[(long)iVar2 + -1 + lVar12];
      iVar2 = piVar9[iVar1];
      lVar12 = (long)iVar2;
      iVar3 = piVar10[iVar1];
      piVar15 = piVar10 + lVar12;
      if (lVar12 < 0) {
        piVar15 = piVar11 + (-2 - lVar12);
      }
      *piVar15 = iVar3;
      if (-1 < (long)iVar3) {
        piVar9[iVar3] = iVar2;
      }
      iVar2 = piVar6[iVar1];
      iVar3 = piVar11[iVar2];
      piVar9[iVar1] = -2 - iVar2;
      piVar10[iVar1] = iVar3;
      piVar11[iVar2] = iVar1;
      if (-1 < (long)iVar3) {
        piVar9[iVar3] = iVar1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < lVar13);
  }
  piVar5 = (this->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[jCol];
  lVar13 = (long)iVar1;
  piVar6 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar6[jCol];
  piVar15 = piVar6 + lVar13;
  if (lVar13 < 0) {
    piVar15 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + (-2 - lVar13);
  }
  *piVar15 = iVar2;
  if (-1 < (long)iVar2) {
    piVar5[iVar2] = iVar1;
  }
  piVar4[jCol] = 0;
  (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[jCol] = 0;
  return;
}

Assistant:

void HFactor::zeroCol(const HighsInt jCol) {
  const HighsInt a_count = mc_count_a[jCol];
  const HighsInt a_start = mc_start[jCol];
  const HighsInt a_end = a_start + a_count;
  for (HighsInt iEl = a_start; iEl < a_end; iEl++) {
    const double abs_value = std::abs(mc_value[iEl]);
    const HighsInt iRow = mc_index[iEl];
    const HighsInt original_row_count = mr_count[iRow];
    // Remove the column index from this row of the row-wise
    // matrix. Also decreases the row count
    rowDelete(jCol, iRow);
    // Remove this row from the linked list of rows containing it
    rlinkDel(iRow);
    // Add the this row to the linked list of rows with this reduced
    // count
    assert(mr_count[iRow] == original_row_count - 1);
    rlinkAdd(iRow, mr_count[iRow]);
    assert(abs_value < pivot_tolerance);
  }
  // Remove the column from the linked list of columns containing it
  clinkDel(jCol);
  // Zero the counts of the active and inactive sections of the column
  mc_count_a[jCol] = 0;
  mc_count_n[jCol] = 0;
}